

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportBaseDirWrapper.cpp
# Opt level: O2

bool __thiscall ImportBaseDirWrapper::wrap(ImportBaseDirWrapper *this)

{
  size_t sVar1;
  int iVar2;
  IMAGE_DATA_DIRECTORY *pIVar3;
  reference ppEVar4;
  size_type sVar5;
  ulong uVar6;
  size_t __n;
  
  (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
    super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x31])();
  (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
    super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x2c])(this);
  sVar1 = this->importsCount;
  this->importsCount = 0;
  this->invalidEntries = 0;
  pIVar3 = DataDirEntryWrapper::getDataDirectory(&this->super_DataDirEntryWrapper);
  if (pIVar3 == (IMAGE_DATA_DIRECTORY *)0x0) {
    __n = this->importsCount;
  }
  else {
    uVar6 = 0;
    __n = 0;
    while ((sVar5 = __n + 1, sVar5 != 0 &&
           (iVar2 = (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                      super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer
                      [0x2e])(this,__n), (char)iVar2 != '\0'))) {
      ppEVar4 = std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>::at
                          (&(this->super_DataDirEntryWrapper).super_PENodeWrapper.
                            super_ExeNodeWrapper.entries,__n);
      if (*ppEVar4 == (value_type)0x0) break;
      iVar2 = (*((*ppEVar4)->super_ExeElementWrapper).super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0x2b])();
      if ((char)iVar2 == '\0') {
        this->invalidEntries = this->invalidEntries + 1;
        if (0x62 < uVar6) break;
        uVar6 = uVar6 + 1;
        __n = sVar5;
      }
      else {
        uVar6 = 0;
        __n = sVar5;
      }
    }
    this->importsCount = __n;
  }
  return sVar1 != __n;
}

Assistant:

bool ImportBaseDirWrapper::wrap()
{
    clearMapping();
    clear();

    size_t oldCount = this->importsCount;
    this->importsCount = 0;
    this->invalidEntries = 0;
    
    if (!getDataDirectory()) {
        return (oldCount != this->importsCount); //has count changed
    }

    const size_t LIMIT = (-1);
    const size_t INVALID_LIMIT = 100;
    size_t cntr = 0;
    size_t invalidSeries = 0;
    for (cntr = 0; cntr < LIMIT; cntr++) {
        if (loadNextEntry(cntr) == false) break;
        ExeNodeWrapper* entry = this->entries.at(cntr);
        if (!entry) break;
        if (entry->isValid()) {
            invalidSeries = 0;
        }
        else {
            invalidSeries++;
            this->invalidEntries++;
            if (invalidSeries >= INVALID_LIMIT) break;
        }
    }

    this->importsCount = cntr;
    return (oldCount != this->importsCount); //has count changed
}